

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O3

void __thiscall cppcms::impl::shared_mutex::shared_mutex(shared_mutex *this)

{
  int iVar1;
  pthread_rwlock_t *m;
  FILE *pFVar2;
  int *piVar3;
  cppcms_error *this_00;
  string local_48;
  
  this->plock_ = (pthread_rwlock_t *)0x0;
  this->flock_ = (FILE *)0x0;
  if (test_pthread_mutex_pshared()::has == '\0') {
    iVar1 = __cxa_guard_acquire(&test_pthread_mutex_pshared()::has);
    if (iVar1 != 0) {
      test_pthread_mutex_pshared()::has = test_pthread_mutex_pshared_impl();
      __cxa_guard_release(&test_pthread_mutex_pshared()::has);
    }
  }
  if (test_pthread_mutex_pshared()::has == '\x01') {
    m = (pthread_rwlock_t *)mmap_anonymous(0x38);
    this->plock_ = m;
    create_rwlock(m,true);
    return;
  }
  this->plock_ = &this->normal_;
  pthread_rwlock_init((pthread_rwlock_t *)&this->normal_,(pthread_rwlockattr_t *)0x0);
  pFVar2 = tmpfile();
  this->flock_ = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    return;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  pthread_rwlock_destroy((pthread_rwlock_t *)this->plock_);
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Failed to create temporary file","");
  cppcms_error::cppcms_error(this_00,iVar1,&local_48);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

shared_mutex() :
			plock_(0),
			flock_(0)
		{
			bool use_pthread=test_pthread_mutex_pshared();
			if(use_pthread) {
				plock_ =reinterpret_cast<pthread_rwlock_t *>(mmap_anonymous(sizeof(pthread_rwlock_t)));
				create_rwlock(plock_,true);
			}
			else {
				plock_=&normal_;
				create_rwlock(plock_,false);
				flock_=tmpfile();
				if(!flock_) {
					int err=errno;
					destroy_rwlock(plock_);
					throw cppcms_error(err,"Failed to create temporary file");
				}
			}
		}